

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O2

void __thiscall QtMWidgets::Picker::insertItems(Picker *this,int index,QStringList *texts)

{
  PickerPrivate *pPVar1;
  ulong uVar2;
  QAbstractItemModel *pQVar3;
  char cVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  QStandardItemModel *pQVar8;
  QStandardItem *this_00;
  P _b;
  QList *pQVar9;
  QList *pQVar10;
  P _a;
  ulong uVar11;
  long lVar12;
  QList<QStandardItem_*> items;
  QModelIndex item;
  QModelIndex local_48;
  
  if ((texts->d).size != 0) {
    uVar5 = count(this);
    if ((int)uVar5 < index) {
      index = uVar5;
    }
    pQVar9 = (QList *)0x0;
    if (0 < index) {
      pQVar9 = (QList *)(ulong)(uint)index;
    }
    pPVar1 = (this->d).d;
    uVar11 = (long)pPVar1->maxCount - (long)pQVar9;
    uVar2 = (texts->d).size;
    if ((long)uVar2 < (long)uVar11) {
      uVar11 = uVar2;
    }
    uVar5 = (uint)uVar11;
    if (0 < (int)uVar5) {
      pQVar8 = qobject_cast<QStandardItemModel*>((QObject *)pPVar1->model);
      if (pQVar8 == (QStandardItemModel *)0x0) {
        pPVar1 = (this->d).d;
        pPVar1->inserting = true;
        pQVar3 = pPVar1->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&items,&pPVar1->root);
        cVar4 = (**(code **)(*(long *)pQVar3 + 0xf8))
                          (pQVar3,pQVar9,uVar11 & 0xffffffff,(QModelIndex *)&items);
        if (cVar4 == '\0') {
          ((this->d).d)->inserting = false;
        }
        else {
          item.r = -1;
          item.c = -1;
          item.i = 0;
          item.m = (QAbstractItemModel *)0x0;
          pQVar10 = pQVar9;
          for (lVar12 = 0; (ulong)(uVar5 & 0x7fffffff) * 0x18 != lVar12; lVar12 = lVar12 + 0x18) {
            pPVar1 = (this->d).d;
            pQVar3 = pPVar1->model;
            iVar6 = pPVar1->modelColumn;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&pPVar1->root);
            (**(code **)(*(long *)pQVar3 + 0x60))((QVariant *)&items,pQVar3,pQVar10,iVar6,&local_48)
            ;
            item.m = (QAbstractItemModel *)items.d.size;
            item._0_8_ = items.d.d;
            item.i = (quintptr)items.d.ptr;
            pQVar3 = ((this->d).d)->model;
            QVariant::QVariant((QVariant *)&items,
                               (QString *)((long)&(((texts->d).ptr)->d).d + lVar12));
            (**(code **)(*(long *)pQVar3 + 0x98))(pQVar3,&item,(QVariant *)&items,0);
            QVariant::~QVariant((QVariant *)&items);
            pQVar10 = (QList *)(ulong)((int)pQVar10 + 1);
          }
          pPVar1 = (this->d).d;
          pPVar1->inserting = false;
          QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&items,&pPVar1->root);
          _q_rowsInserted(this,(QModelIndex *)&items,(int)pQVar9,(int)pQVar9 + uVar5 + -1);
        }
      }
      else {
        items.d.d = (Data *)0x0;
        items.d.ptr = (QStandardItem **)0x0;
        items.d.size = 0;
        iVar6 = QStandardItemModel::invisibleRootItem();
        for (lVar12 = 0; (ulong)(uVar5 & 0x7fffffff) * 0x18 - lVar12 != 0; lVar12 = lVar12 + 0x18) {
          this_00 = (QStandardItem *)operator_new(0x10);
          QStandardItem::QStandardItem(this_00,(QString *)((long)&(((texts->d).ptr)->d).d + lVar12))
          ;
          QList<QStandardItem_*>::append(&items,this_00);
        }
        QStandardItem::insertRows(iVar6,pQVar9);
        QArrayDataPointer<QStandardItem_*>::~QArrayDataPointer(&items.d);
      }
      iVar7 = count(this);
      pPVar1 = (this->d).d;
      iVar6 = pPVar1->maxCount;
      if (iVar7 - iVar6 != 0 && iVar6 <= iVar7) {
        pQVar3 = pPVar1->model;
        QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)&items,&pPVar1->root);
        (**(code **)(*(long *)pQVar3 + 0x108))(pQVar3,iVar6,iVar7 - iVar6,(QModelIndex *)&items);
      }
    }
  }
  return;
}

Assistant:

void
PickerPrivate::initDrawOffsetForFirstUse()
{
	if( !wasPainted && q->count() < itemsCount )
	{
		const int freeItemsCount = ( itemsCount - q->count() );

		const int maxOffset = freeItemsCount * stringHeight +
			( freeItemsCount > 0 ? freeItemsCount - 1 : 0 ) * itemTopMargin;

		drawItemOffset = maxOffset / 2;

		wasPainted = true;
	}
}